

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

int32_t ymfm::opn_lfo_pm_phase_adjustment
                  (uint32_t fnum_bits,uint32_t pm_sensitivity,int32_t lfo_raw_pm)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  
  uVar1 = -lfo_raw_pm;
  if (0 < lfo_raw_pm) {
    uVar1 = lfo_raw_pm;
  }
  bVar3 = 0;
  if (4 < pm_sensitivity) {
    bVar3 = (char)pm_sensitivity - 5;
  }
  iVar4 = (int)((fnum_bits >>
                (opn_lfo_pm_phase_adjustment::s_lfo_pm_shifts[pm_sensitivity][uVar1 & 7] & 0xf)) +
                (fnum_bits >>
                (opn_lfo_pm_phase_adjustment::s_lfo_pm_shifts[pm_sensitivity][uVar1 & 7] >> 4)) <<
               (bVar3 & 0x1f)) >> 2;
  iVar2 = -iVar4;
  if (-1 < lfo_raw_pm) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

inline int32_t opn_lfo_pm_phase_adjustment(uint32_t fnum_bits, uint32_t pm_sensitivity, int32_t lfo_raw_pm)
{
	// this table encodes 2 shift values to apply to the top 7 bits
	// of fnum; it is effectively a cheap multiply by a constant
	// value containing 0-2 bits
	static uint8_t const s_lfo_pm_shifts[8][8] =
	{
		{ 0x77, 0x77, 0x77, 0x77, 0x77, 0x77, 0x77, 0x77 },
		{ 0x77, 0x77, 0x77, 0x77, 0x72, 0x72, 0x72, 0x72 },
		{ 0x77, 0x77, 0x77, 0x72, 0x72, 0x72, 0x17, 0x17 },
		{ 0x77, 0x77, 0x72, 0x72, 0x17, 0x17, 0x12, 0x12 },
		{ 0x77, 0x77, 0x72, 0x17, 0x17, 0x17, 0x12, 0x07 },
		{ 0x77, 0x77, 0x17, 0x12, 0x07, 0x07, 0x02, 0x01 },
		{ 0x77, 0x77, 0x17, 0x12, 0x07, 0x07, 0x02, 0x01 },
		{ 0x77, 0x77, 0x17, 0x12, 0x07, 0x07, 0x02, 0x01 }
	};

	// look up the relevant shifts
	int32_t abs_pm = (lfo_raw_pm < 0) ? -lfo_raw_pm : lfo_raw_pm;
	uint32_t const shifts = s_lfo_pm_shifts[pm_sensitivity][bitfield(abs_pm, 0, 3)];

	// compute the adjustment
	int32_t adjust = (fnum_bits >> bitfield(shifts, 0, 4)) + (fnum_bits >> bitfield(shifts, 4, 4));
	if (pm_sensitivity > 5)
		adjust <<= pm_sensitivity - 5;
	adjust >>= 2;

	// every 16 cycles it inverts sign
	return (lfo_raw_pm < 0) ? -adjust : adjust;
}